

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> * __thiscall
callback_data::calc_diff
          (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__return_storage_ptr__,
          callback_data *this)

{
  pointer ppgVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  size_t j;
  long lVar5;
  ulong uVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ggml_tensor *diff_filtered;
  ggml_tensor *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  fVar7 = 0.0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  while (ppgVar1 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
        fVar7 < (float)(ulong)((long)(this->v_pos).
                                     super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar1 >> 3
                              )) {
    uVar6 = (long)(fVar7 - 9.223372e+18) & (long)fVar7 >> 0x3f | (long)fVar7;
    pvVar2 = ppgVar1[uVar6]->data;
    pvVar3 = (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
             .super__Vector_impl_data._M_start[uVar6]->data;
    local_48 = fVar7;
    uStack_44 = uVar8;
    uStack_40 = uVar9;
    uStack_3c = uVar10;
    lVar4 = ggml_nelements();
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      *(float *)((long)pvVar2 + lVar5 * 4) =
           *(float *)((long)pvVar2 + lVar5 * 4) - *(float *)((long)pvVar3 + lVar5 * 4);
    }
    local_50 = filter_nonzero_rows(this,(this->v_pos).
                                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar6]);
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              (&this->v_diff_filtered,&local_50);
    uVar8 = uStack_44;
    uVar9 = uStack_40;
    uVar10 = uStack_3c;
    fVar7 = local_48 + 1.0;
  }
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            (__return_storage_ptr__,&this->v_diff_filtered);
  return __return_storage_ptr__;
}

Assistant:

std::vector<struct ggml_tensor *> calc_diff() {
        for (float il = 0; il < v_pos.size(); il++) {
            float * a = (float *) v_pos[il]->data;
            float * b = (float *) v_neg[il]->data;
            size_t n_elem = ggml_nelements(v_pos[il]);
            for (size_t j = 0; j < n_elem; j++) {
                a[j] -= b[j];
            }
            //print_debug_tensor(v_pos[i]);
            auto diff_filtered = filter_nonzero_rows(v_pos[il]);
            v_diff_filtered.push_back(diff_filtered);
        }
        return v_diff_filtered; // for convinient, we return the result std::vector
    }